

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void swrenderer::R_SetupBuffer(void)

{
  int fuzzoff;
  BYTE *pBVar1;
  int iVar2;
  long lVar3;
  int local_1c;
  int i;
  BYTE *lineptr;
  int pitch;
  
  fuzzoff = DCanvas::GetPitch(RenderTarget);
  pBVar1 = DCanvas::GetBuffer(RenderTarget);
  iVar2 = viewwindowy * fuzzoff;
  lVar3 = (long)viewwindowx;
  if ((drawerargs::dc_pitch != fuzzoff) || (pBVar1 + lVar3 + iVar2 != R_SetupBuffer::lastbuff)) {
    if (drawerargs::dc_pitch != fuzzoff) {
      drawerargs::dc_pitch = fuzzoff;
      R_InitFuzzTable(fuzzoff);
    }
    drawerargs::dc_destorg = pBVar1 + lVar3 + iVar2;
    for (local_1c = 0; iVar2 = DCanvas::GetHeight(RenderTarget), local_1c < iVar2;
        local_1c = local_1c + 1) {
      *(int *)(ylookup + (long)local_1c * 4) = local_1c * fuzzoff;
    }
  }
  return;
}

Assistant:

void R_SetupBuffer ()
{
	static BYTE *lastbuff = NULL;

	int pitch = RenderTarget->GetPitch();
	BYTE *lineptr = RenderTarget->GetBuffer() + viewwindowy*pitch + viewwindowx;

	if (dc_pitch != pitch || lineptr != lastbuff)
	{
		if (dc_pitch != pitch)
		{
			dc_pitch = pitch;
			R_InitFuzzTable (pitch);
		}
		dc_destorg = lineptr;
		for (int i = 0; i < RenderTarget->GetHeight(); i++)
		{
			ylookup[i] = i * pitch;
		}
	}
}